

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_extensions.cpp
# Opt level: O0

bool __thiscall ONX_Model::SetDocumentUserString(ONX_Model *this,wchar_t *key,wchar_t *string_value)

{
  ON_DocumentUserStringList *this_00;
  wchar_t *string_value_local;
  wchar_t *key_local;
  ONX_Model *this_local;
  
  if ((key == (wchar_t *)0x0) || (*key == L'\0')) {
    this_local._7_1_ = false;
  }
  else {
    if (this->m_model_user_string_list == (ON_DocumentUserStringList *)0x0) {
      this_00 = (ON_DocumentUserStringList *)::operator_new(0x10);
      ON_DocumentUserStringList::ON_DocumentUserStringList(this_00);
      this->m_model_user_string_list = this_00;
    }
    this_local._7_1_ =
         ON_Object::SetUserString(&this->m_model_user_string_list->super_ON_Object,key,string_value)
    ;
  }
  return this_local._7_1_;
}

Assistant:

bool ONX_Model::SetDocumentUserString( const wchar_t* key, const wchar_t* string_value )
{
  if (nullptr == key || 0 == key[0] )
    return false;
  if ( nullptr == m_model_user_string_list )
    m_model_user_string_list = new ON_DocumentUserStringList();
  return m_model_user_string_list->SetUserString(key,string_value);
}